

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool char1(Env *env,int32_t c)

{
  int32_t iVar1;
  
  iVar1 = peek(env,1);
  return iVar1 == c;
}

Assistant:

static bool char1(Env *env, int32_t c) {
  return char_at(env, 1, c);
}